

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O0

void __thiscall xe::TcpIpRecvThread::run(TcpIpRecvThread *this)

{
  Socket *this_00;
  MessageType messageType_00;
  deSocketResult dVar1;
  reference pvVar2;
  size_type sVar3;
  Error *pEVar4;
  size_t local_80;
  deUint8 *local_78;
  exception *e;
  size_t sStack_50;
  deSocketResult result;
  size_t numRecv;
  size_t bytesToRecv;
  size_t curSize;
  MessageType local_24;
  size_t sStack_20;
  MessageType messageType;
  size_t messageSize;
  bool hasPayload;
  TcpIpRecvThread *pTStack_10;
  bool hasHeader;
  TcpIpRecvThread *this_local;
  
  pTStack_10 = this;
  while( true ) {
    while( true ) {
      messageSize._7_1_ = 7 < this->m_curMsgPos;
      messageSize._6_1_ = false;
      sStack_20 = 0;
      local_24 = MESSAGETYPE_NONE;
      if ((bool)messageSize._7_1_) {
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->m_curMsgBuf,0);
        xs::Message::parseHeader(pvVar2,8,&local_24,&stack0xffffffffffffffe0);
        messageSize._6_1_ = sStack_20 <= this->m_curMsgPos;
      }
      messageType_00 = local_24;
      if ((bool)messageSize._6_1_ == false) break;
      if (this->m_curMsgPos < 9) {
        local_78 = (deUint8 *)0x0;
      }
      else {
        local_78 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&this->m_curMsgBuf,8);
      }
      handleMessage(this,messageType_00,local_78,sStack_20 - 8);
      this->m_curMsgPos = 0;
    }
    if ((messageSize._7_1_ & 1) == 0) {
      local_80 = 8;
    }
    else {
      local_80 = sStack_20;
    }
    bytesToRecv = local_80;
    numRecv = local_80 - this->m_curMsgPos;
    sStack_50 = 0;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_curMsgBuf);
    if (sVar3 < bytesToRecv) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_curMsgBuf,bytesToRecv);
    }
    this_00 = this->m_socket;
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_curMsgBuf,this->m_curMsgPos);
    dVar1 = de::Socket::receive(this_00,pvVar2,numRecv,&stack0xffffffffffffffb0);
    if (dVar1 == DE_SOCKETRESULT_CONNECTION_CLOSED) {
      pEVar4 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(pEVar4,"Connection closed","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x143);
      __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
    }
    if (dVar1 == DE_SOCKETRESULT_CONNECTION_TERMINATED) {
      pEVar4 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(pEVar4,"Connection terminated","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x145);
      __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
    }
    if (dVar1 == DE_SOCKETRESULT_ERROR) break;
    if (dVar1 == DE_SOCKETRESULT_WOULD_BLOCK) {
      deYield();
    }
    else {
      this->m_curMsgPos = sStack_50 + this->m_curMsgPos;
    }
  }
  pEVar4 = (Error *)__cxa_allocate_exception(0x10);
  Error::Error(pEVar4,"Socket error","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
               ,0x147);
  __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void TcpIpRecvThread::run (void)
{
	try
	{
		for (;;)
		{
			bool				hasHeader		= m_curMsgPos >= xs::MESSAGE_HEADER_SIZE;
			bool				hasPayload		= false;
			size_t				messageSize		= 0;
			xs::MessageType		messageType		= (xs::MessageType)0;

			if (hasHeader)
			{
				xs::Message::parseHeader(&m_curMsgBuf[0], xs::MESSAGE_HEADER_SIZE, messageType, messageSize);
				hasPayload = m_curMsgPos >= messageSize;
			}

			if (hasPayload)
			{
				// Process message.
				handleMessage(messageType, m_curMsgPos > xs::MESSAGE_HEADER_SIZE ? &m_curMsgBuf[xs::MESSAGE_HEADER_SIZE] : DE_NULL, messageSize-xs::MESSAGE_HEADER_SIZE);
				m_curMsgPos = 0;
			}
			else
			{
				// Try to receive missing bytes.
				size_t				curSize			= hasHeader ? messageSize : (size_t)xs::MESSAGE_HEADER_SIZE;
				size_t				bytesToRecv		= curSize-m_curMsgPos;
				size_t				numRecv			= 0;
				deSocketResult		result			= DE_SOCKETRESULT_LAST;

				if (m_curMsgBuf.size() < curSize)
					m_curMsgBuf.resize(curSize);

				result = m_socket.receive(&m_curMsgBuf[m_curMsgPos], bytesToRecv, &numRecv);

				if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
					XE_FAIL("Connection closed");
				else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
					XE_FAIL("Connection terminated");
				else if (result == DE_SOCKETRESULT_ERROR)
					XE_FAIL("Socket error");
				else if (result == DE_SOCKETRESULT_WOULD_BLOCK)
				{
					// \note Socket should not be in non-blocking mode.
					DE_ASSERT(numRecv == 0);
					deYield();
				}
				else
				{
					DE_ASSERT(result == DE_SOCKETRESULT_SUCCESS);
					DE_ASSERT(numRecv <= bytesToRecv);
					m_curMsgPos += numRecv;
					// Continue receiving bytes / handle message in next iter.
				}
			}
		}
	}
	catch (const std::exception& e)
	{
		m_state.setState(COMMLINKSTATE_ERROR, e.what());
	}
}